

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void VP8LHistogramInit(VP8LHistogram *p,int palette_code_bits,int init_arrays)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  p->palette_code_bits_ = palette_code_bits;
  if (init_arrays == 0) {
    *(undefined8 *)((long)&p->red_cost_ + 5) = 0;
    *(undefined8 *)((long)&p->blue_cost_ + 5) = 0;
    *(undefined8 *)((long)&p->literal_cost_ + 4) = 0;
    *(undefined8 *)((long)&p->red_cost_ + 4) = 0;
    *(undefined8 *)&p->trivial_symbol_ = 0;
    *(undefined8 *)((long)&p->bit_cost_ + 4) = 0;
    return;
  }
  iVar1 = p->palette_code_bits_;
  puVar2 = p->literal_;
  iVar3 = (4 << ((byte)iVar1 & 0x1f)) + 0x1138;
  if (iVar1 < 1) {
    iVar3 = 0x1138;
  }
  memset(p,0,(long)iVar3);
  p->palette_code_bits_ = iVar1;
  p->literal_ = puVar2;
  return;
}

Assistant:

void VP8LHistogramInit(VP8LHistogram* const p, int palette_code_bits,
                       int init_arrays) {
  p->palette_code_bits_ = palette_code_bits;
  if (init_arrays) {
    HistogramClear(p);
  } else {
    p->trivial_symbol_ = 0;
    p->bit_cost_ = 0;
    p->literal_cost_ = 0;
    p->red_cost_ = 0;
    p->blue_cost_ = 0;
    memset(p->is_used_, 0, sizeof(p->is_used_));
  }
}